

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O3

void __thiscall TcpConn::TmpSend(TcpConn *this)

{
  Buffer *this_00;
  BufferChain *pBVar1;
  int iVar2;
  uint32_t uVar3;
  BufferChain *pBVar4;
  
  this_00 = &this->super_Buffer;
  if (((this->super_Buffer).m_writeTail == (BufferChain *)0x0) &&
     (iVar2 = Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x12), iVar2 != 0)) {
    pBVar4 = (this->super_Buffer).m_head;
    while (pBVar4 != (BufferChain *)0x0) {
      if (pBVar4->refcount == 0) {
        __assert_fail("tmp->refcount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.h"
                      ,0x2d,"void Buffer::Clear()");
      }
      pBVar1 = pBVar4->nextpkt;
      uVar3 = pBVar4->refcount - 1;
      pBVar4->refcount = uVar3;
      pBVar4 = pBVar1;
      if (uVar3 == 0) {
        (*this_00->_vptr_Buffer[1])(this_00);
      }
    }
    (this->super_Buffer).len = 0;
    (this->super_Buffer).m_writeHead = (BufferChain *)0x0;
    (this->super_Buffer).m_writeTail = (BufferChain *)0x0;
    (this->super_Buffer).m_head = (BufferChain *)0x0;
    (this->super_Buffer).m_end = (BufferChain *)0x0;
  }
  else {
    for (pBVar4 = (this->super_Buffer).m_head; pBVar4 != (BufferChain *)0x0;
        pBVar4 = pBVar4->nextpkt) {
      Buffer::AddWriteChain(this_00,pBVar4);
    }
    (this->super_Buffer).m_head = (BufferChain *)0x0;
    (this->super_Buffer).m_end = (BufferChain *)0x0;
  }
  return;
}

Assistant:

void TcpConn::TmpSend()
{
    // 打开epoll写入检测
    if(m_writeTail == nullptr)
    {
        int32_t ret = m_pPoller->Mod(this, EV_WRITE|EV_ET);
        if(ret != 0)
        {
            Clear();
            return;
        }
    }

    for(auto* bc = m_head; bc != nullptr; bc = bc->nextpkt)
    {
        this->AddWriteChain(bc);
    }

    m_head = nullptr;
    m_end = nullptr;
}